

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

void yy_2_pair(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  
  PVIP_node_change_type(G->val[-2],PVIP_NODE_STRING);
  PVIP_node_change_type(G->val[-1],PVIP_NODE_STRING);
  pPVar1 = PVIP_node_new_children2(&G->data,PVIP_NODE_PAIR,G->val[-2],G->val[-1]);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_2_pair(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define value G->val[-1]
#define key G->val[-2]
#define v G->val[-3]
#define k G->val[-4]
  yyprintf((stderr, "do yy_2_pair"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
        PVIP_node_change_type(key, PVIP_NODE_STRING);\n\
        PVIP_node_change_type(value, PVIP_NODE_STRING);\n\
        yy = PVIP_node_new_children2(&(G->data), PVIP_NODE_PAIR, key, value);\n\
    }\n"));
  
        PVIP_node_change_type(key, PVIP_NODE_STRING);
        PVIP_node_change_type(value, PVIP_NODE_STRING);
        yy = PVIP_node_new_children2(&(G->data), PVIP_NODE_PAIR, key, value);
    ;
#undef value
#undef key
#undef v
#undef k
}